

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cc
# Opt level: O0

void __thiscall libwebm::TempFileDeleter::~TempFileDeleter(TempFileDeleter *this)

{
  byte bVar1;
  undefined8 uVar2;
  char *__filename;
  undefined1 local_218 [8];
  ifstream file;
  TempFileDeleter *this_local;
  
  uVar2 = std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_218,uVar2,8);
  bVar1 = std::ios::good();
  if ((bVar1 & 1) != 0) {
    std::ifstream::close();
    __filename = (char *)std::__cxx11::string::c_str();
    remove(__filename);
  }
  std::ifstream::~ifstream(local_218);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

TempFileDeleter::~TempFileDeleter() {
  std::ifstream file(file_name_.c_str());
  if (file.good()) {
    file.close();
    std::remove(file_name_.c_str());
  }
}